

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O1

FIRSTPASS_STATS * av1_firstpass_info_peek(FIRSTPASS_INFO *firstpass_info,int offset_from_cur)

{
  if ((-firstpass_info->past_stats_count <= offset_from_cur) &&
     (offset_from_cur < firstpass_info->future_stats_count)) {
    return firstpass_info->stats_buf +
           (offset_from_cur + firstpass_info->cur_index) % firstpass_info->stats_buf_size;
  }
  return (FIRSTPASS_STATS *)0x0;
}

Assistant:

const FIRSTPASS_STATS *av1_firstpass_info_peek(
    const FIRSTPASS_INFO *firstpass_info, int offset_from_cur) {
  if (offset_from_cur >= -firstpass_info->past_stats_count &&
      offset_from_cur < firstpass_info->future_stats_count) {
    const int index = (firstpass_info->cur_index + offset_from_cur) %
                      firstpass_info->stats_buf_size;
    return &firstpass_info->stats_buf[index];
  } else {
    return NULL;
  }
}